

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
           *this,ostream *os)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  StringRef in_stack_ffffffffffffff98;
  string local_30 [48];
  
  Detail::stringify<std::__cxx11::string>(in_RSI);
  Detail::stringify<std::basic_string_view<char,std::char_traits<char>>>
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff88);
  formatReconstructedExpression
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff98,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }